

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

uint32 __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::GenChunkMask
          (anon_unknown_0 *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields,vector<int,_std::allocator<int>_> *has_bit_indices)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char *pcVar4;
  LogMessage *other;
  int iVar5;
  int extraout_EDX;
  ulong uVar6;
  ulong extraout_RDX;
  uint uVar7;
  LogFinisher local_71;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_70;
  LogMessage local_68;
  
  iVar5 = (int)has_bit_indices;
  puVar3 = *(undefined8 **)this;
  local_70 = fields;
  if (puVar3 == *(undefined8 **)(this + 8)) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0x1cc);
    fields = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)internal::LogMessage::operator<<(&local_68,"CHECK failed: !fields.empty(): ");
    internal::LogFinisher::operator=(&local_71,(LogMessage *)fields);
    internal::LogMessage::~LogMessage(&local_68);
    puVar3 = *(undefined8 **)this;
    iVar5 = extraout_EDX;
  }
  pcVar4 = FieldDescriptor::index((FieldDescriptor *)*puVar3,(char *)fields,iVar5);
  iVar5 = *(int *)((long)(local_70->
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start + (long)(int)pcVar4 * 4);
  uVar6 = (long)iVar5 % 0x20 & 0xffffffff;
  puVar2 = *(undefined8 **)(this + 8);
  uVar7 = 0;
  for (puVar3 = *(undefined8 **)this; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    pcVar4 = FieldDescriptor::index((FieldDescriptor *)*puVar3,(char *)fields,(int)uVar6);
    uVar1 = *(uint *)((long)(local_70->
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            )._M_impl.super__Vector_impl_data._M_start + (long)(int)pcVar4 * 4);
    uVar6 = (long)(int)uVar1 % 0x20 & 0xffffffff;
    if (iVar5 / 0x20 != (int)uVar1 / 0x20) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0x1d2);
      fields = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)internal::LogMessage::operator<<
                            (&local_68,"CHECK failed: (first_index_offset) == (index / 32): ");
      internal::LogFinisher::operator=(&local_71,(LogMessage *)fields);
      internal::LogMessage::~LogMessage(&local_68);
      uVar6 = extraout_RDX;
    }
    uVar7 = uVar7 | 1 << (uVar1 & 0x1f);
  }
  if (uVar7 == 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0x1d5);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: (0) != (chunk_mask): ");
    internal::LogFinisher::operator=(&local_71,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  return uVar7;
}

Assistant:

uint32 GenChunkMask(const std::vector<const FieldDescriptor*>& fields,
                    const std::vector<int>& has_bit_indices) {
  GOOGLE_CHECK(!fields.empty());
  int first_index_offset = has_bit_indices[fields.front()->index()] / 32;
  uint32 chunk_mask = 0;
  for (auto field : fields) {
    // "index" defines where in the _has_bits_ the field appears.
    int index = has_bit_indices[field->index()];
    GOOGLE_CHECK_EQ(first_index_offset, index / 32);
    chunk_mask |= static_cast<uint32>(1) << (index % 32);
  }
  GOOGLE_CHECK_NE(0, chunk_mask);
  return chunk_mask;
}